

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall
CTPNConst::gen_code_member
          (CTPNConst *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,int varargs,
          CTcNamedArgs *named_args)

{
  tc_constval_type_t tVar1;
  
  tVar1 = (this->super_CTPNConstBase).val_.typ_;
  if ((2 < tVar1 - TC_CVT_SSTR) && (tVar1 != TC_CVT_FLOAT)) {
    if (tVar1 == TC_CVT_OBJ) {
      CTcSymObj::s_gen_code_member
                (discard,prop_expr,prop_is_expr,argc,(this->super_CTPNConstBase).val_.val_.propval_,
                 varargs,named_args);
      return;
    }
    CTcTokenizer::log_error(0x2cff);
    return;
  }
  (**(this->super_CTPNConstBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)
            (this,0,0);
  if (varargs == 0) {
    varargs = 0;
  }
  else {
    CTcGenTarg::write_op(G_cg,0x8d);
  }
  CTcPrsNode::s_gen_member_rhs(discard,prop_expr,prop_is_expr,argc,varargs,named_args);
  return;
}

Assistant:

void CTPNConst::gen_code_member(int discard,
                                CTcPrsNode *prop_expr, int prop_is_expr,
                                int argc, int varargs, CTcNamedArgs *named_args)
{
    /* check our constant type */
    switch(val_.get_type())
    {
    case TC_CVT_OBJ:
        /* call the object symbol code to do the work */
        CTcSymObj::s_gen_code_member(discard, prop_expr, prop_is_expr,
                                     argc, val_.get_val_obj(),
                                     varargs, named_args);
        break;

    case TC_CVT_LIST:
    case TC_CVT_SSTR:
    case TC_CVT_RESTR:
    case TC_CVT_FLOAT:
        /* 
         *   list/string/BigNumber constant - generate our value as
         *   normal, then use the standard member generation 
         */
        gen_code(FALSE, FALSE);

        /* if we have an argument counter, put it back on top */
        if (varargs)
            G_cg->write_op(OPC_SWAP);

        /* use standard member generation */
        CTcPrsNode::s_gen_member_rhs(discard, prop_expr, prop_is_expr,
                                     argc, varargs, named_args);
        break;

    default:
        G_tok->log_error(TCERR_INVAL_OBJ_EXPR);
        break;
    }
}